

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-c.cpp
# Opt level: O0

duckdb_string duckdb_value_string_internal(duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  duckdb_type dVar2;
  idx_t in_RDX;
  duckdb_result *in_RSI;
  duckdb_result *in_RDI;
  duckdb_string dVar3;
  duckdb_string res;
  undefined1 local_10 [16];
  
  bVar1 = CanFetchValue(in_RDI,(idx_t)in_RSI,in_RDX);
  if (bVar1) {
    dVar2 = duckdb_column_type(in_RDI,(idx_t)in_RSI);
    if (dVar2 == DUCKDB_TYPE_VARCHAR) {
      local_10._0_8_ = duckdb::UnsafeFetch<char*>(in_RSI,in_RDX,0x191d962);
      local_10._8_8_ = strlen((char *)local_10._0_8_);
    }
    else {
      local_10 = (undefined1  [16])duckdb::FetchDefaultValue::Operation<duckdb_string>();
    }
  }
  else {
    local_10 = (undefined1  [16])duckdb::FetchDefaultValue::Operation<duckdb_string>();
  }
  dVar3.data = (char *)local_10._0_8_;
  dVar3.size = local_10._8_8_;
  return dVar3;
}

Assistant:

duckdb_string duckdb_value_string_internal(duckdb_result *result, idx_t col, idx_t row) {
	if (!CanFetchValue(result, col, row)) {
		return FetchDefaultValue::Operation<duckdb_string>();
	}
	if (duckdb_column_type(result, col) != DUCKDB_TYPE_VARCHAR) {
		return FetchDefaultValue::Operation<duckdb_string>();
	}
	// FIXME: this obviously does not work when there are null bytes in the string
	// we need to remove the deprecated C result materialization to get that to work correctly
	// since the deprecated C result materialization stores strings as null-terminated
	duckdb_string res;
	res.data = UnsafeFetch<char *>(result, col, row);
	res.size = strlen(res.data);
	return res;
}